

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::CuriosityWheel::CuriosityWheel
          (CuriosityWheel *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,CuriosityWheelType wheel_type)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_f8;
  ChVector<double> local_e8;
  ChQuaternion<double> local_d0;
  ChFrame<double> local_b0;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_f8,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  CuriosityPart::CuriosityPart
            (&this->super_CuriosityPart,name,rel_pos,
             (shared_ptr<chrono::ChMaterialSurface> *)&_Stack_f8,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f8._M_refcount);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_001a09c8;
  std::__cxx11::string::assign((char *)&(this->super_CuriosityPart).m_mesh_name);
  auVar2._8_4_ = 0x3f800000;
  auVar2._0_8_ = 0x3f8000003f800000;
  auVar2._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar2);
  (this->super_CuriosityPart).m_color.R = (float)(int)uVar1;
  (this->super_CuriosityPart).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_CuriosityPart).m_color.B = 1.0;
  (this->super_CuriosityPart).m_mass = 1.7812830345854127;
  (this->super_CuriosityPart).m_inertia.m_data[0] = 0.07923769199375999;
  (this->super_CuriosityPart).m_inertia.m_data[1] = 0.11097450306524229;
  (this->super_CuriosityPart).m_inertia.m_data[2] = 0.07923769199375999;
  local_d0.m_data[0] = 1.0;
  local_e8.m_data[2] = 0.0;
  local_d0.m_data[3] = 0.0;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  local_d0.m_data[1] = 0.0;
  local_d0.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_b0,&local_e8,&local_d0);
  ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_b0);
  return;
}

Assistant:

CuriosityWheel::CuriosityWheel(const std::string& name,
                               const ChFrame<>& rel_pos,
                               std::shared_ptr<ChMaterialSurface> mat,
                               CuriosityWheelType wheel_type)
    : CuriosityPart(name, rel_pos, mat, true) {
    switch (wheel_type) {
        default:
        case CuriosityWheelType::RealWheel:
            m_mesh_name = "curiosity_wheel";
            break;
        case CuriosityWheelType::SimpleWheel:
            m_mesh_name = "curiosity_simplewheel";
            break;
        case CuriosityWheelType::CylWheel:
            m_mesh_name = "curiosity_cylwheel";
            break;
    }
    m_color = ChColor(1.0f, 1.0f, 1.0f);

    double radius = 0.25;       // wheel radius
    double width = 0.40;        // wheel width
    double thickness = 0.8e-3;  // average thickness
    double density = 2700;      // aluminum
    double radius1 = radius - thickness;
    double vol = (CH_C_2PI * radius * width + CH_C_PI * radius * radius) * thickness;
    double gyration1 = (3 * (radius * radius + radius1 * radius1) + width * width) / 12.0;
    double gyration2 = (radius * radius + radius1 * radius1) / 2.0;
    m_mass = density * vol;
    m_inertia = ChVector<>(gyration1, gyration2, gyration1) * m_mass;
    m_cog = ChFrame<>();
}